

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetRepaintManager::paintAndFlush(QWidgetRepaintManager *this)

{
  QRegion *this_00;
  uint *puVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  QWidgetPrivate *pQVar6;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var7;
  long *plVar8;
  QWidget *pQVar9;
  QWidgetData *pQVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  QRegion QVar15;
  char cVar16;
  bool bVar17;
  uint uVar18;
  Stream *__old_val;
  QLoggingCategory *pQVar19;
  undefined8 uVar20;
  QPoint QVar21;
  QGraphicsEffect *pQVar22;
  QWidget *pQVar23;
  long lVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  QPoint QVar27;
  QPaintDevice *pQVar28;
  undefined8 in_RCX;
  QWidgetRepaintManager *pQVar29;
  int iVar30;
  QWidgetRepaintManager *pQVar31;
  QPoint this_01;
  QVLABase<QWidget*> *pQVar32;
  long lVar33;
  int iVar34;
  uint uVar35;
  pointer *__ptr;
  long *plVar36;
  int iVar37;
  QRect *rect;
  ulong uVar38;
  long *plVar39;
  long in_FS_OFFSET;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QRegion newVisible;
  QRegion widgetDirty;
  QRegion dirtyBeforeSubtractedOpaqueChildren;
  bool hasDirtySiblingsAbove;
  QRegion toClean;
  QRegion dirtyCopy;
  QVarLengthArray<QWidget_*,_32LL> opaqueNonOverlappedWidgets;
  QRect local_240;
  QPoint local_230;
  QPoint local_228;
  bool local_219;
  QRegion local_218;
  QRegion local_210;
  QDebug local_208;
  QtPrivate local_200 [8];
  QRectF local_1f8 [5];
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined8 uStack_148;
  char *local_140 [33];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar19 = QtPrivateLogging::lcWidgetPainting();
  bVar3 = *(byte *)((long)&pQVar19->field_2 + 3);
  pQVar29 = (QWidgetRepaintManager *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar3);
  if ((bVar3 & 1) != 0) {
    local_140[0] = pQVar19->name;
    local_158 = 2;
    iStack_154 = 0;
    iStack_150 = 0;
    iStack_14c = 0;
    uStack_148._0_4_ = 0;
    uStack_148._4_4_ = 0;
    QMessageLogger::info();
    QVar15.d = local_218.d;
    QVar40.m_data = (storage_type *)0x1b;
    QVar40.m_size = (qsizetype)local_1f8;
    QString::fromUtf8(QVar40);
    QTextStream::operator<<((QTextStream *)QVar15.d,(QString *)local_1f8);
    if ((QPoint)local_1f8[0].xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8[0].xp = (int)*(Type *)local_1f8[0].xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8[0].xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8[0].xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_218.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_218.d,' ');
    }
    QVar15.d = local_218.d;
    QVar41.m_data = (storage_type *)0x9;
    QVar41.m_size = (qsizetype)local_1f8;
    QString::fromUtf8(QVar41);
    QTextStream::operator<<((QTextStream *)QVar15.d,(QString *)local_1f8);
    if ((QPoint)local_1f8[0].xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8[0].xp = (int)*(Type *)local_1f8[0].xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8[0].xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8[0].xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_218.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_218.d,' ');
    }
    local_210.d = local_218.d;
    *(int *)(local_218.d + 0x28) = *(int *)(local_218.d + 0x28) + 1;
    ::operator<<((Stream *)&local_240,&local_210);
    uVar20 = local_240._0_8_;
    QVar42.m_data = (storage_type *)0x11;
    QVar42.m_size = (qsizetype)local_1f8;
    QString::fromUtf8(QVar42);
    QTextStream::operator<<((QTextStream *)uVar20,(QString *)local_1f8);
    if ((QPoint)local_1f8[0].xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8[0].xp = (int)*(Type *)local_1f8[0].xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8[0].xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8[0].xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_240._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_240._0_8_,' ');
    }
    *(int *)(local_240._0_8_ + 0x28) = *(int *)(local_240._0_8_ + 0x28) + 1;
    pQVar29 = this + 0x18;
    local_208.stream = (Stream *)0x0;
    local_1f8[0].xp = (qreal)local_240._0_8_;
    QtPrivate::printSequentialContainer<QList<QWidget*>>
              (local_200,(Stream *)local_1f8,"QList",(QList<QWidget_*> *)pQVar29);
    QDebug::~QDebug((QDebug *)local_1f8);
    QDebug::~QDebug((QDebug *)local_200);
    QDebug::~QDebug(&local_208);
    QDebug::~QDebug((QDebug *)&local_240);
    QDebug::~QDebug((QDebug *)&local_210);
    QDebug::~QDebug((QDebug *)&local_218);
  }
  lVar24 = *(long *)(*(long *)this + 0x20);
  uVar18 = *(uint *)(lVar24 + 8);
  iVar30 = *(int *)(lVar24 + 0x14);
  uVar4 = *(uint *)(lVar24 + 0x18);
  iVar34 = *(int *)(lVar24 + 0x1c);
  iVar5 = *(int *)(lVar24 + 0x20);
  if ((uVar18 >> 10 & 1) == 0) {
    uVar20 = QBackingStore::size();
    plVar39 = QGuiApplicationPrivate::platform_integration;
    pQVar29 = (QWidgetRepaintManager *)(ulong)uVar4;
    uVar35 = (iVar34 - iVar30) + 1;
    iVar37 = (iVar5 - uVar4) + 1;
    if ((uVar35 == (uint)uVar20) && (iVar37 == (int)((ulong)uVar20 >> 0x20))) {
      bVar17 = false;
    }
    else if ((*(long *)(this + 0x78) == 0) ||
            ((uVar20 = QBackingStore::size(), (int)((ulong)uVar20 >> 0x20) < 1 || (int)uVar20 < 1 ||
             (cVar16 = (**(code **)(*plVar39 + 0x10))(plVar39), cVar16 == '\0')))) {
      pQVar31 = (QWidgetRepaintManager *)&local_158;
      QRegion::QRegion((QRegion *)pQVar31,0,0,uVar35,iVar37,Rectangle);
      uVar20 = *(undefined8 *)(this + 0x10);
      pQVar29 = (QWidgetRepaintManager *)CONCAT44(iStack_154,local_158);
      *(QWidgetRepaintManager **)(this + 0x10) = pQVar29;
      local_158 = (int)uVar20;
      iStack_154 = (int)((ulong)uVar20 >> 0x20);
      QRegion::~QRegion((QRegion *)pQVar31);
      if (*(long *)(this + 0x28) != 0) {
        uVar38 = 0;
        do {
          resetWidget(pQVar31,*(QWidget **)(*(long *)(this + 0x20) + uVar38 * 8));
          uVar38 = uVar38 + 1;
        } while (uVar38 < *(ulong *)(this + 0x28));
      }
      QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
      bVar17 = true;
    }
    else {
      local_158 = -0x55555556;
      iStack_154 = 0xaaaaaaaa;
      iStack_150 = 0xaaaaaaaa;
      iStack_14c = 0xaaaaaaaa;
      uVar20 = QBackingStore::size();
      iStack_150 = (int)uVar20 + -1;
      local_158 = 0;
      iStack_154 = 0;
      iStack_14c = (int)((ulong)uVar20 >> 0x20) + -1;
      local_1f8[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      staticContents((QWidgetRepaintManager *)local_1f8,(QWidget *)this,(QRect *)0x0);
      local_240._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar29 = (QWidgetRepaintManager *)(ulong)uVar35;
      bVar17 = false;
      QRegion::QRegion((QRegion *)&local_240,0,0,uVar35,iVar37,Rectangle);
      QRegion::operator-=((QRegion *)&local_240,(QRegion *)local_1f8);
      QRegion::operator+=((QRegion *)(this + 0x10),(QRegion *)&local_240);
      QBackingStore::setStaticContents(*(QRegion **)(this + 8));
      QRegion::~QRegion((QRegion *)&local_240);
      QRegion::~QRegion((QRegion *)local_1f8);
    }
  }
  else {
    bVar17 = false;
  }
  uVar20 = QBackingStore::size();
  iVar30 = (iVar34 - iVar30) + 1;
  iVar34 = (iVar5 - uVar4) + 1;
  if ((iVar30 != (int)uVar20) || (iVar34 != (int)((ulong)uVar20 >> 0x20))) {
    local_158 = iVar30;
    iStack_154 = iVar34;
    QBackingStore::resize(*(QSize **)(this + 8));
  }
  if ((uVar18 >> 10 & 1) != 0) goto LAB_0031ce99;
  local_218.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QVar27 = (QPoint)((long)this + 0x10);
  QRegion::QRegion(&local_218,(QRegion *)QVar27);
  memset(&local_158,0xaa,0x118);
  local_158 = 0x20;
  iStack_154 = 0;
  iStack_150 = 0;
  iStack_14c = 0;
  uStack_148 = local_140;
  if (*(long *)(this + 0x28) != 0) {
    uVar38 = 0;
    do {
      local_240._0_8_ = *(QPoint *)(*(long *)(this + 0x20) + uVar38 * 8);
      pQVar6 = *(QWidgetPrivate **)(local_240._0_8_ + 8);
      if (((pQVar6->data).field_0x12 & 4) == 0) {
        local_1f8[0]._0_16_ = (undefined1  [16])QWidgetPrivate::clipRect(pQVar6);
        this_00 = &pQVar6->dirty;
        QRegion::operator&=(this_00,(QRect *)local_1f8);
        QWidgetPrivate::clipToEffectiveMask(pQVar6,this_00);
        local_219 = false;
        if ((pQVar6->field_0x252 & 0x20) == 0) {
          pQVar29 = (QWidgetRepaintManager *)0x0;
          QWidgetPrivate::subtractOpaqueSiblings(pQVar6,this_00,&local_219,false);
        }
        local_228 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion((QRegion *)&local_228,this_00);
        if ((pQVar6->field_0x252 & 0x30) == 0) {
          lVar24 = *(long *)(local_240._0_8_ + 0x20);
          pQVar29 = (QWidgetRepaintManager *)
                    CONCAT44(*(int *)(lVar24 + 0x20) - *(int *)(lVar24 + 0x18),
                             *(int *)(lVar24 + 0x1c) - *(int *)(lVar24 + 0x14));
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pQVar29;
          local_1f8[0]._0_16_ = auVar13 << 0x40;
          QWidgetPrivate::subtractOpaqueChildren(pQVar6,this_00,(QRect *)local_1f8);
        }
        cVar16 = QRegion::isEmpty();
        if ((cVar16 != '\0') && ((pQVar6->field_0x253 & 2) != 0)) {
          QRegion::operator=(this_00,(QRegion *)&local_228);
        }
        pQVar31 = (QWidgetRepaintManager *)this_00;
        cVar16 = QRegion::isEmpty();
        if (cVar16 == '\0') {
          local_230 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          if ((QPoint)local_240._0_8_ == *(QPoint *)this) {
            QRegion::QRegion((QRegion *)&local_230,this_00);
          }
          else {
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_1f8[0].yp;
            local_1f8[0]._0_16_ = auVar12 << 0x40;
            QVar21 = QWidget::mapTo((QWidget *)local_240._0_8_,(QWidget *)*(QPoint *)this,
                                    (QPoint *)local_1f8);
            pQVar29 = (QWidgetRepaintManager *)((ulong)QVar21 >> 0x20);
            QRegion::translated((int)&local_230,(int)this_00);
          }
          pQVar31 = (QWidgetRepaintManager *)&local_218;
          QRegion::operator+=((QRegion *)pQVar31,(QRegion *)&local_230);
          QVar21 = (QPoint)local_240._0_8_;
          if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
            do {
              this_01 = QVar21;
              pQVar22 = QWidget::graphicsEffect((QWidget *)QVar21);
              if (pQVar22 != (QGraphicsEffect *)0x0) goto LAB_0031c73e;
              pQVar29 = *(QWidgetRepaintManager **)((long)QVar21 + 8);
              QVar21 = *(QPoint *)(pQVar29 + 0x10);
            } while (QVar21 != (QPoint)0x0);
            if ((local_219 == false) && ((pQVar6->field_0x252 & 2) != 0)) {
              local_1f8[0]._0_16_ = QRegion::boundingRect();
              this_01 = QVar27;
              cVar16 = QRegion::intersects((QRect *)QVar27);
              if (cVar16 == '\0') {
                if (CONCAT44(iStack_14c,iStack_150) == CONCAT44(iStack_154,local_158)) {
                  local_1f8[0].xp = (qreal)local_240._0_8_;
                  pQVar29 = (QWidgetRepaintManager *)local_1f8;
                  QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                            ((QVLABase<QWidget*> *)&local_158,0x20,local_140,(QWidget **)pQVar29);
                }
                else {
                  pQVar29 = (QWidgetRepaintManager *)&local_240;
                  QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                            ((QVLABase<QWidget*> *)&local_158,0x20,local_140,(QWidget **)pQVar29);
                }
                goto LAB_0031c755;
              }
            }
LAB_0031c73e:
            resetWidget((QWidgetRepaintManager *)this_01,(QWidget *)local_240._0_8_);
            QRegion::operator+=((QRegion *)QVar27,(QRegion *)&local_230);
          }
          else {
            resetWidget(pQVar31,(QWidget *)local_240._0_8_);
          }
LAB_0031c755:
          QRegion::~QRegion((QRegion *)&local_230);
        }
        else {
          resetWidget(pQVar31,(QWidget *)local_240._0_8_);
        }
        QRegion::~QRegion((QRegion *)&local_228);
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 < *(ulong *)(this + 0x28));
  }
  QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
  pQVar6 = *(QWidgetPrivate **)(*(long *)this + 8);
  QWidgetPrivate::createTLExtra(pQVar6);
  _Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
  super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
       (((pQVar6->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
  plVar39 = *(long **)((long)_Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
  plVar8 = *(long **)((long)_Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
  plVar36 = plVar39;
  if (plVar8 != plVar39) {
    do {
      if ((long *)*plVar36 != (long *)0x0) {
        (**(code **)(*(long *)*plVar36 + 0x20))();
      }
      *plVar36 = 0;
      plVar36 = plVar36 + 1;
    } while (plVar36 != plVar8);
    *(long **)((long)_Var7.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                     super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0) = plVar39;
  }
  findAllTextureWidgetsRecursively(*(QWidget **)this,*(QWidget **)this);
  pQVar31 = (QWidgetRepaintManager *)&local_218;
  cVar16 = QRegion::isEmpty();
  if (cVar16 == '\0') {
    plVar39 = *(long **)((long)_Var7.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
    plVar8 = *(long **)((long)_Var7.
                              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                              .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
    if (plVar39 != plVar8) {
      do {
        pQVar31 = (QWidgetRepaintManager *)*plVar39;
        iVar30 = QPlatformTextureList::count();
        if (0 < iVar30) {
          iVar30 = 0;
          do {
            lVar24 = QPlatformTextureList::source((int)*plVar39);
            if (*(long *)(this + 0x40) == 0) {
LAB_0031cb0c:
              pQVar29 = (QWidgetRepaintManager *)0xffffffffffffffff;
            }
            else {
              lVar33 = -8;
              do {
                lVar2 = lVar33 + *(long *)(this + 0x40) * -8;
                if (lVar2 == -8) goto LAB_0031cb06;
                pQVar29 = (QWidgetRepaintManager *)(lVar33 + 8);
                lVar14 = lVar33 + 8;
                lVar33 = (long)pQVar29;
              } while (*(long *)(lVar14 + *(long *)(this + 0x38)) != lVar24);
              pQVar29 = (QWidgetRepaintManager *)((long)pQVar29 >> 3);
LAB_0031cb06:
              if (lVar2 == -8) goto LAB_0031cb0c;
            }
            if (pQVar29 != (QWidgetRepaintManager *)0xffffffffffffffff) {
              local_1f8[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_1f8[0].yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_1f8[0]._0_16_ = QPlatformTextureList::geometry((int)*plVar39);
              puVar1 = (uint *)(*(long *)(lVar24 + 8) + 0x250);
              *puVar1 = *puVar1 | 0x8000000;
              QRegion::operator+=((QRegion *)QVar27,(QRect *)local_1f8);
              QRegion::operator+=(&local_218,(QRect *)local_1f8);
            }
            iVar30 = iVar30 + 1;
            pQVar31 = (QWidgetRepaintManager *)*plVar39;
            iVar34 = QPlatformTextureList::count();
          } while (iVar30 < iVar34);
        }
        plVar39 = plVar39 + 1;
      } while (plVar39 != plVar8);
    }
    if (*(long *)(this + 0x40) != 0) {
      uVar38 = 0;
      do {
        resetWidget(pQVar31,*(QWidget **)(*(long *)(this + 0x38) + uVar38 * 8));
        uVar38 = uVar38 + 1;
      } while (uVar38 < *(ulong *)(this + 0x40));
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
      QBackingStore::beginPaint(*(QRegion **)(this + 8));
      updateStaticContentsSize(this);
      local_1f8[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)local_1f8,(QRegion *)QVar27);
      QRegion::QRegion((QRegion *)&local_240);
      QVar27 = *(QPoint *)(this + 0x10);
      *(int *)(this + 0x10) = local_240.x1.m_i;
      *(int *)(this + 0x14) = local_240.y1.m_i;
      local_240._0_8_ = QVar27;
      QRegion::~QRegion((QRegion *)&local_240);
      this[0x88] = (QWidgetRepaintManager)0x0;
      if (0 < CONCAT44(iStack_14c,iStack_150)) {
        lVar24 = 0;
        do {
          pQVar9 = (QWidget *)uStack_148[lVar24];
          pQVar6 = *(QWidgetPrivate **)&pQVar9->field_0x8;
          uVar18 = *(uint *)&pQVar6->field_0x250;
          pQVar23 = *(QWidget **)this;
          pQVar29 = (QWidgetRepaintManager *)&local_240;
          local_240._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)pQVar29,&pQVar6->dirty);
          resetWidget(pQVar29,pQVar9);
          local_228.xp.m_i = 0;
          local_228.yp.m_i = 0;
          if (pQVar9 != *(QWidget **)this) {
            local_230.xp.m_i = 0;
            local_230.yp.m_i = 0;
            QVar27 = QWidget::mapTo(pQVar9,*(QWidget **)this,&local_230);
            local_228.yp.m_i = local_228.yp.m_i + QVar27.yp.m_i.m_i;
            local_228.xp.m_i = local_228.xp.m_i + QVar27.xp.m_i.m_i;
          }
          pQVar28 = (QPaintDevice *)QBackingStore::paintDevice();
          QWidgetPrivate::drawWidget
                    (pQVar6,pQVar28,(QRegion *)&local_240,&local_228,
                     (DrawWidgetFlags)
                     ((uint)((uVar18 & 0x300000) == 0) * 0x20 + (uint)(pQVar9 == pQVar23) + 4),
                     (QPainter *)0x0,(QWidgetRepaintManager *)this);
          QRegion::~QRegion((QRegion *)&local_240);
          lVar24 = lVar24 + 1;
        } while (lVar24 < CONCAT44(iStack_14c,iStack_150));
      }
      if (bVar17) {
LAB_0031ce15:
        pQVar6 = *(QWidgetPrivate **)(*(long *)this + 8);
        pQVar28 = (QPaintDevice *)QBackingStore::paintDevice();
        local_240.x1.m_i = 0;
        local_240.y1.m_i = 0;
        QWidgetPrivate::drawWidget
                  (pQVar6,pQVar28,(QRegion *)local_1f8,(QPoint *)&local_240,(DrawWidgetFlags)0x105,
                   (QPainter *)0x0,(QWidgetRepaintManager *)this);
      }
      else {
        cVar16 = QRegion::isEmpty();
        if (cVar16 == '\0') goto LAB_0031ce15;
      }
      QBackingStore::endPaint();
      flush(this);
      QRegion::~QRegion((QRegion *)local_1f8);
    }
    else {
      updateStaticContentsSize(this);
      QRegion::QRegion((QRegion *)local_1f8);
      uVar20 = *(undefined8 *)(this + 0x10);
      *(qreal *)(this + 0x10) = local_1f8[0].xp;
      local_1f8[0].xp = (qreal)uVar20;
      QRegion::~QRegion((QRegion *)local_1f8);
      this[0x88] = (QWidgetRepaintManager)0x0;
      puVar25 = (undefined8 *)QRegion::begin();
      puVar26 = (undefined8 *)QRegion::end();
      if (puVar25 != puVar26) {
        do {
          iVar30 = (int)*puVar25;
          iVar34 = (int)((ulong)*puVar25 >> 0x20);
          dVar11 = (double)iVar34;
          local_1f8[0].yp._0_4_ = SUB84(dVar11,0);
          local_1f8[0].xp = (double)iVar30;
          local_1f8[0].yp._4_4_ = (int)((ulong)dVar11 >> 0x20);
          local_1f8[0].w = (qreal)(((long)*(int *)(puVar25 + 1) - (long)iVar30) + 1);
          local_1f8[0].h = (qreal)(((long)*(int *)((long)puVar25 + 0xc) - (long)iVar34) + 1);
          QGraphicsItem::update
                    ((QGraphicsItem *)
                     (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) + 0x10),
                     local_1f8);
          puVar25 = puVar25 + 2;
        } while (puVar25 != puVar26);
      }
    }
  }
  else {
    memset(local_1f8,0xaa,0x98);
    local_1f8[0]._0_16_ = ZEXT816(0x10);
    local_1f8[0].w = (qreal)((long)local_1f8 + 0x18);
    uVar18 = (uint)*(undefined8 *)(this + 0x40);
    if (0x10 < (long)(int)uVar18) {
      QVLABase<QWidget_*>::reallocate_impl
                ((QVLABase<QWidget_*> *)local_1f8,0x10,(void *)((long)local_1f8 + 0x18),0,
                 (long)(int)uVar18);
    }
    if (0 < (int)uVar18) {
      uVar38 = 0;
      do {
        local_228 = *(QPoint *)(*(long *)(this + 0x38) + uVar38 * 8);
        pQVar32 = (QVLABase<QWidget*> *)local_1f8;
        if (local_1f8[0].yp == local_1f8[0].xp) {
          local_240._0_8_ = local_228;
          QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                    ((QVLABase<QWidget*> *)local_1f8,0x10,(void *)((long)local_1f8 + 0x18),
                     (QWidget **)&local_240);
        }
        else {
          QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                    ((QVLABase<QWidget*> *)local_1f8,0x10,(void *)((long)local_1f8 + 0x18),
                     (QWidget **)&local_228);
        }
        resetWidget((QWidgetRepaintManager *)pQVar32,(QWidget *)local_228);
        uVar38 = uVar38 + 1;
      } while ((uVar18 & 0x7fffffff) != uVar38);
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    if (0 < (int)uVar18) {
      uVar38 = 0;
      do {
        pQVar9 = *(QWidget **)((long)local_1f8[0].w + uVar38 * 8);
        pQVar6 = *(QWidgetPrivate **)&pQVar9->field_0x8;
        pQVar10 = pQVar9->data;
        local_240.x2.m_i = (pQVar10->crect).x2.m_i - (pQVar10->crect).x1.m_i;
        local_240.y2.m_i = (pQVar10->crect).y2.m_i - (pQVar10->crect).y1.m_i;
        local_240.x1.m_i = 0;
        local_240.y1.m_i = 0;
        QRegion::QRegion((QRegion *)&local_228,&local_240,Rectangle);
        QWidgetPrivate::sendPaintEvent(pQVar6,(QRegion *)&local_228);
        QRegion::~QRegion((QRegion *)&local_228);
        if (pQVar9 != *(QWidget **)this) {
          pQVar23 = QWidget::nativeParentWidget(pQVar9);
          bVar17 = hasPlatformWindow(pQVar9);
          if ((bVar17) || ((pQVar23 != (QWidget *)0x0 && (pQVar23 != *(QWidget **)this)))) {
            bVar17 = hasPlatformWindow(pQVar9);
            if (bVar17) {
              pQVar23 = pQVar9;
            }
            QRegion::QRegion((QRegion *)&local_240);
            markNeedsFlush(this,pQVar23,(QRegion *)&local_240);
            QRegion::~QRegion((QRegion *)&local_240);
          }
        }
        uVar38 = uVar38 + 1;
      } while ((uVar18 & 0x7fffffff) != uVar38);
    }
    flush(this);
    if (local_1f8[0].w != (qreal)((long)local_1f8 + 0x18)) {
      QtPrivate::sizedFree((void *)local_1f8[0].w,(long)local_1f8[0].xp << 3);
    }
  }
  if (uStack_148 != local_140) {
    QtPrivate::sizedFree(uStack_148,CONCAT44(iStack_154,local_158) << 3);
  }
  QRegion::~QRegion(&local_218);
LAB_0031ce99:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::paintAndFlush()
{
    qCInfo(lcWidgetPainting) << "Painting and flushing dirty"
        << "top level" << dirty << "and dirty widgets" << dirtyWidgets;

    const bool updatesDisabled = !tlw->updatesEnabled();
    bool repaintAllWidgets = false;

    const QRect tlwRect = tlw->data->crect;
    if (!updatesDisabled && store->size() != tlwRect.size()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (hasStaticContents() && !store->size().isEmpty()
            && integration->hasCapability(QPlatformIntegration::BackingStoreStaticContents)) {
            // Repaint existing dirty area and newly visible area.
            const QRect clipRect(QPoint(0, 0), store->size());
            const QRegion staticRegion(staticContents(nullptr, clipRect));
            QRegion newVisible(0, 0, tlwRect.width(), tlwRect.height());
            newVisible -= staticRegion;
            dirty += newVisible;
            store->setStaticContents(staticRegion);
        } else {
            // Repaint everything.
            dirty = QRegion(0, 0, tlwRect.width(), tlwRect.height());
            for (int i = 0; i < dirtyWidgets.size(); ++i)
                resetWidget(dirtyWidgets.at(i));
            dirtyWidgets.clear();
            repaintAllWidgets = true;
        }
    }

    if (store->size() != tlwRect.size())
        store->resize(tlwRect.size());

    if (updatesDisabled)
        return;

    // Contains everything that needs repaint.
    QRegion toClean(dirty);

    // Loop through all update() widgets and remove them from the list before they are
    // painted (in case someone calls update() in paintEvent). If the widget is opaque
    // and does not have transparent overlapping siblings, append it to the
    // opaqueNonOverlappedWidgets list and paint it directly without composition.
    QVarLengthArray<QWidget *, 32> opaqueNonOverlappedWidgets;
    for (int i = 0; i < dirtyWidgets.size(); ++i) {
        QWidget *w = dirtyWidgets.at(i);
        QWidgetPrivate *wd = w->d_func();
        if (wd->data.in_destructor)
            continue;

        // Clip with mask() and clipRect().
        wd->dirty &= wd->clipRect();
        wd->clipToEffectiveMask(wd->dirty);

        // Subtract opaque siblings and children.
        bool hasDirtySiblingsAbove = false;
        // We know for sure that the widget isn't overlapped if 'isMoved' is true.
        if (!wd->isMoved)
            wd->subtractOpaqueSiblings(wd->dirty, &hasDirtySiblingsAbove);

        // Make a copy of the widget's dirty region, to restore it in case there is an opaque
        // render-to-texture child that completely covers the widget, because otherwise the
        // render-to-texture child won't be visible, due to its parent widget not being redrawn
        // with a proper blending mask.
        const QRegion dirtyBeforeSubtractedOpaqueChildren = wd->dirty;

        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            wd->subtractOpaqueChildren(wd->dirty, w->rect());

        if (wd->dirty.isEmpty() && wd->textureChildSeen)
            wd->dirty = dirtyBeforeSubtractedOpaqueChildren;

        if (wd->dirty.isEmpty()) {
            resetWidget(w);
            continue;
        }

        const QRegion widgetDirty(w != tlw ? wd->dirty.translated(w->mapTo(tlw, QPoint()))
                                           : wd->dirty);
        toClean += widgetDirty;

#if QT_CONFIG(graphicsview)
        if (tlw->d_func()->extra->proxyWidget) {
            resetWidget(w);
            continue;
        }
#endif

        if (!isDrawnInEffect(w) && !hasDirtySiblingsAbove && wd->isOpaque
                && !dirty.intersects(widgetDirty.boundingRect())) {
            opaqueNonOverlappedWidgets.append(w);
        } else {
            resetWidget(w);
            dirty += widgetDirty;
        }
    }
    dirtyWidgets.clear();

    // Find all render-to-texture child widgets (including self).
    // The search is cut at native widget boundaries, meaning that each native child widget
    // has its own list for the subtree below it.
    QTLWExtra *tlwExtra = tlw->d_func()->topData();
    tlwExtra->widgetTextures.clear();
    findAllTextureWidgetsRecursively(tlw, tlw);

    if (toClean.isEmpty()) {
        // Nothing to repaint. However renderToTexture widgets are handled
        // specially, they are not in the regular dirty list, in order to
        // prevent triggering unnecessary backingstore painting when only the
        // texture content changes. Check if we have such widgets in the special
        // dirty list.
        QVarLengthArray<QWidget *, 16> paintPending;
        const int numPaintPending = dirtyRenderToTextureWidgets.size();
        paintPending.reserve(numPaintPending);
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = dirtyRenderToTextureWidgets.at(i);
            paintPending << w;
            resetWidget(w);
        }
        dirtyRenderToTextureWidgets.clear();
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = paintPending[i];
            w->d_func()->sendPaintEvent(w->rect());
            if (w != tlw) {
                QWidget *npw = w->nativeParentWidget();
                if (hasPlatformWindow(w) || (npw && npw != tlw)) {
                    if (!hasPlatformWindow(w))
                        w = npw;
                    markNeedsFlush(w);
                }
            }
        }

        // We might have newly exposed areas on the screen if this function was
        // called from sync(QWidget *, QRegion)), so we have to make sure those
        // are flushed. We also need to composite the renderToTexture widgets.
        flush();

        return;
    }

    for (const auto &tl : tlwExtra->widgetTextures) {
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if (dirtyRenderToTextureWidgets.contains(w)) {
                const QRect rect = tl->geometry(i); // mapped to the tlw already
                // Set a flag to indicate that the paint event for this
                // render-to-texture widget must not to be optimized away.
                w->d_func()->renderToTextureReallyDirty = 1;
                dirty += rect;
                toClean += rect;
            }
        }
    }
    for (int i = 0; i < dirtyRenderToTextureWidgets.size(); ++i)
        resetWidget(dirtyRenderToTextureWidgets.at(i));
    dirtyRenderToTextureWidgets.clear();

#if QT_CONFIG(graphicsview)
    if (tlw->d_func()->extra->proxyWidget) {
        updateStaticContentsSize();
        dirty = QRegion();
        updateRequestSent = false;
        for (const QRect &rect : toClean)
            tlw->d_func()->extra->proxyWidget->update(rect);
        return;
    }
#endif

    store->beginPaint(toClean);

    // Must do this before sending any paint events because
    // the size may change in the paint event.
    updateStaticContentsSize();
    const QRegion dirtyCopy(dirty);
    dirty = QRegion();
    updateRequestSent = false;

    // Paint opaque non overlapped widgets.
    for (int i = 0; i < opaqueNonOverlappedWidgets.size(); ++i) {
        QWidget *w = opaqueNonOverlappedWidgets[i];
        QWidgetPrivate *wd = w->d_func();

        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawRecursive;
        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            flags |= QWidgetPrivate::DontDrawOpaqueChildren;
        if (w == tlw)
            flags |= QWidgetPrivate::DrawAsRoot;

        QRegion toBePainted(wd->dirty);
        resetWidget(w);

        QPoint offset;
        if (w != tlw)
            offset += w->mapTo(tlw, QPoint());
        wd->drawWidget(store->paintDevice(), toBePainted, offset, flags, nullptr, this);
    }

    // Paint the rest with composition.
    if (repaintAllWidgets || !dirtyCopy.isEmpty()) {
        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawAsRoot | QWidgetPrivate::DrawRecursive
                | QWidgetPrivate::UseEffectRegionBounds;
        tlw->d_func()->drawWidget(store->paintDevice(), dirtyCopy, QPoint(), flags, nullptr, this);
    }

    store->endPaint();

    flush();
}